

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O2

CLibrary * clib_new(lua_State *L,GCtab *mt)

{
  TValue *pTVar1;
  GCtab *env;
  GCudata *pGVar2;
  
  env = lj_tab_new(L,0,0);
  pGVar2 = lj_udata_new(L,0x10,env);
  *(GCtab **)&pGVar2[1].marked = env;
  pGVar2->udtype = '\x02';
  (pGVar2->metatable).gcptr64 = (uint64_t)mt;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = (ulong)pGVar2 | 0xfff9800000000000;
  return (CLibrary *)(pGVar2 + 1);
}

Assistant:

static CLibrary *clib_new(lua_State *L, GCtab *mt)
{
  GCtab *t = lj_tab_new(L, 0, 0);
  GCudata *ud = lj_udata_new(L, sizeof(CLibrary), t);
  CLibrary *cl = (CLibrary *)uddata(ud);
  cl->cache = t;
  ud->udtype = UDTYPE_FFI_CLIB;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcref(ud->metatable, obj2gco(mt));
  setudataV(L, L->top++, ud);
  return cl;
}